

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
fasttext::HierarchicalSoftmaxLoss::buildTree
          (HierarchicalSoftmaxLoss *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  *this_00;
  int iVar1;
  pointer pNVar2;
  pointer plVar3;
  pointer pNVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  vector<bool,_std::allocator<bool>_> *pvVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 in_ZMM3 [64];
  vector<int,_std::allocator<int>_> path;
  undefined1 local_88 [8];
  iterator iStack_80;
  _Bit_type *local_78;
  int local_64;
  vector<bool,_std::allocator<bool>_> local_60;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_38;
  
  auVar26 = in_ZMM3._0_32_;
  this_00 = &this->tree_;
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::resize(this_00,(long)this->osz_ * 2 - 1);
  iVar1 = this->osz_;
  uVar9 = (ulong)iVar1;
  iVar6 = iVar1 * 2 + -1;
  if (0 < (long)uVar9) {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(1000000000000000));
    auVar21 = vpbroadcastq_avx512f(ZEXT816(8));
    pNVar2 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    auVar26 = vpcmpeqd_avx2(auVar26,auVar26);
    iVar11 = 1;
    if (1 < iVar6) {
      iVar11 = iVar6;
    }
    uVar13 = (ulong)(iVar11 + 7U & 0xfffffff8);
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vpbroadcastq_avx512f();
    do {
      uVar5 = vpcmpuq_avx512f(auVar19,auVar22,2);
      auVar24 = vpsllq_avx512f(auVar19,5);
      auVar25 = vpaddq_avx512f(auVar23,auVar24);
      vpscatterqd_avx512f(ZEXT832(pNVar2) + auVar24._0_32_,uVar5,auVar26);
      vpscatterqd_avx512f(ZEXT832(4) + auVar25._0_32_,uVar5,auVar26);
      vpscatterqd_avx512f(ZEXT832(8) + auVar25._0_32_,uVar5,auVar26);
      vpscatterqq_avx512f(ZEXT864(0x10) + auVar25,uVar5,auVar20);
      if ((uVar5 & 1) != 0) {
        *(undefined1 *)(auVar25._0_8_ + 0x18) = 0;
      }
      if ((uVar5 & 2) != 0) {
        lVar14 = vpextrq_avx(auVar25._0_16_,1);
        *(undefined1 *)(lVar14 + 0x18) = 0;
      }
      if ((uVar5 & 4) != 0) {
        *(undefined1 *)(auVar25._16_8_ + 0x18) = 0;
      }
      if ((uVar5 & 8) != 0) {
        lVar14 = vpextrq_avx(auVar25._16_16_,1);
        *(undefined1 *)(lVar14 + 0x18) = 0;
      }
      auVar18 = vextracti32x4_avx512f(auVar25,2);
      if ((uVar5 & 0x10) != 0) {
        *(undefined1 *)(auVar18._0_8_ + 0x18) = 0;
      }
      if ((uVar5 & 0x20) != 0) {
        lVar14 = vpextrq_avx(auVar18,1);
        *(undefined1 *)(lVar14 + 0x18) = 0;
      }
      auVar18 = vextracti32x4_avx512f(auVar25,3);
      if ((uVar5 & 0x40) != 0) {
        *(undefined1 *)(auVar18._0_8_ + 0x18) = 0;
      }
      if ((uVar5 & 0x80) != 0) {
        lVar14 = vpextrq_avx(auVar18,1);
        *(undefined1 *)(lVar14 + 0x18) = 0;
      }
      auVar19 = vpaddq_avx512f(auVar19,auVar21);
      uVar13 = uVar13 - 8;
    } while (uVar13 != 0);
    if (0 < iVar1) {
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pNVar2 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar14 = 0;
      do {
        *(undefined8 *)((long)&pNVar2->count + lVar14 * 4) = *(undefined8 *)((long)plVar3 + lVar14);
        lVar14 = lVar14 + 8;
      } while (uVar9 * 8 - lVar14 != 0);
    }
  }
  if (iVar1 < iVar6) {
    pNVar2 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = iVar1 - 1;
    uVar13 = uVar9;
    do {
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      auVar18._12_4_ = 0;
      auVar18._0_12_ = stack0xffffffffffffff7c;
      _local_88 = (_Bit_iterator_base)(auVar18 << 0x20);
      pNVar4 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar16 = &local_60;
      bVar8 = true;
      do {
        bVar10 = bVar8;
        uVar15 = (uint)uVar13;
        if (((int)uVar12 < 0) || (pNVar4[(int)uVar15].count <= pNVar4[uVar12].count)) {
          uVar13 = (ulong)(uVar15 + 1);
          uVar7 = uVar12;
        }
        else {
          uVar7 = uVar12 - 1;
          uVar15 = uVar12;
        }
        uVar12 = uVar7;
        *(uint *)&(pvVar16->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = uVar15;
        pvVar16 = (vector<bool,_std::allocator<bool>_> *)local_88;
        bVar8 = false;
      } while (bVar10);
      pNVar2[uVar9].left =
           (int)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      lVar14 = (long)(int)local_88._0_4_;
      pNVar2[uVar9].right = local_88._0_4_;
      pNVar2[uVar9].count =
           pNVar2[lVar14].count +
           pNVar2[(int)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].count;
      pNVar2[(int)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].parent =
           (int32_t)uVar9;
      pNVar2[lVar14].parent = (int32_t)uVar9;
      uVar9 = uVar9 + 1;
      pNVar2[lVar14].binary = true;
    } while (uVar9 != (long)iVar6);
  }
  if (0 < iVar1) {
    local_38 = &this->codes_;
    lVar14 = 0;
    do {
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_78 = (_Bit_type *)0x0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      local_88 = (undefined1  [8])0x0;
      iStack_80._M_current._0_4_ = 0;
      iStack_80._M_current._4_4_ = 0;
      iVar1 = (this_00->
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar14].parent;
      lVar17 = lVar14;
      while (iVar1 != -1) {
        local_64 = iVar1 - this->osz_;
        if ((_Bit_type *)iStack_80._M_current == local_78) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_88,iStack_80,&local_64);
        }
        else {
          *iStack_80._M_current = local_64;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (&local_60,
                   (this_00->
                   super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar17].binary);
        pNVar2 = (this_00->
                 super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar17 = (long)pNVar2[lVar17].parent;
        iVar1 = pNVar2[lVar17].parent;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&this->paths_,(vector<int,_std::allocator<int>_> *)local_88);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_38,&local_60);
      if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_88 != (undefined1  [8])0x0) {
        operator_delete((void *)local_88,(long)local_78 - (long)local_88);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->osz_);
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::buildTree(const std::vector<int64_t>& counts) {
  tree_.resize(2 * osz_ - 1);
  for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
    tree_[i].parent = -1;
    tree_[i].left = -1;
    tree_[i].right = -1;
    tree_[i].count = 1e15;
    tree_[i].binary = false;
  }
  for (int32_t i = 0; i < osz_; i++) {
    tree_[i].count = counts[i];
  }
  int32_t leaf = osz_ - 1;
  int32_t node = osz_;
  for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
    int32_t mini[2] = {0};
    for (int32_t j = 0; j < 2; j++) {
      if (leaf >= 0 && tree_[leaf].count < tree_[node].count) {
        mini[j] = leaf--;
      } else {
        mini[j] = node++;
      }
    }
    tree_[i].left = mini[0];
    tree_[i].right = mini[1];
    tree_[i].count = tree_[mini[0]].count + tree_[mini[1]].count;
    tree_[mini[0]].parent = i;
    tree_[mini[1]].parent = i;
    tree_[mini[1]].binary = true;
  }
  for (int32_t i = 0; i < osz_; i++) {
    std::vector<int32_t> path;
    std::vector<bool> code;
    int32_t j = i;
    while (tree_[j].parent != -1) {
      path.push_back(tree_[j].parent - osz_);
      code.push_back(tree_[j].binary);
      j = tree_[j].parent;
    }
    paths_.push_back(path);
    codes_.push_back(code);
  }
}